

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t *
Acb_DerivePatchSupport
          (Cnf_Dat_t *pCnf,int iTar,int nTargets,int nCoDivs,Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF,
          Vec_Int_t *vSuppOld,int TimeOut)

{
  lit *end;
  bool bVar1;
  sat_solver *s;
  int iVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  sat_solver *psVar5;
  abctime aVar6;
  abctime aVar7;
  Vec_Int_t *vWeights;
  Vec_Int_t *pVVar8;
  long lVar9;
  ulong uVar10;
  abctime time;
  abctime time_00;
  abctime time_01;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  timespec ts;
  int pLits [2];
  lit local_bc;
  sat_solver *local_b8;
  timespec local_b0;
  Vec_Int_t *local_a0;
  long local_98;
  uint local_90;
  int local_8c;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  uint local_6c;
  int local_68;
  int local_64;
  long local_60;
  ulong local_58;
  Vec_Int_t *local_50;
  Acb_Ntk_t *local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = vDivs;
  local_48 = pNtkF;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 100;
  pVVar3->nSize = 0;
  piVar4 = (int *)malloc(400);
  pVVar3->pArray = piVar4;
  iVar14 = pCnf->nVars;
  psVar5 = sat_solver_new();
  local_88 = (ulong)(uint)nCoDivs;
  sat_solver_setnvars(psVar5,nCoDivs + pCnf->nVars * 2);
  lVar9 = 0;
  while (lVar9 < pCnf->nClauses) {
    iVar2 = sat_solver_addclause(psVar5,pCnf->pClauses[lVar9],pCnf->pClauses[lVar9 + 1]);
    lVar9 = lVar9 + 1;
    if (iVar2 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  local_bc = 2;
  local_a0 = pVVar3;
  iVar2 = sat_solver_addclause(psVar5,&local_bc,(lit *)&local_b8);
  if (iVar2 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pCnf->pMan = (Aig_Man_t *)0x0;
  Cnf_DataLift(pCnf,pCnf->nVars);
  lVar9 = 0;
  while (lVar9 < pCnf->nClauses) {
    iVar2 = sat_solver_addclause(psVar5,pCnf->pClauses[lVar9],pCnf->pClauses[lVar9 + 1]);
    lVar9 = lVar9 + 1;
    if (iVar2 == 0) {
      return (Vec_Int_t *)0x0;
    }
  }
  Cnf_DataLift(pCnf,-pCnf->nVars);
  if (pCnf->nVars < -1) {
LAB_00370cf8:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_bc = pCnf->nVars * 2 + 2;
  iVar2 = sat_solver_addclause(psVar5,&local_bc,(lit *)&local_b8);
  if (iVar2 == 0) {
    return (Vec_Int_t *)0x0;
  }
  iVar14 = (iVar14 - nTargets) + iTar;
  if (iVar14 < 0) goto LAB_00370cf8;
  local_bc = iVar14 * 2 + 1;
  iVar2 = sat_solver_addclause(psVar5,&local_bc,(lit *)&local_b8);
  if (iVar2 == 0) {
    return (Vec_Int_t *)0x0;
  }
  iVar14 = iVar14 + pCnf->nVars;
  if (iVar14 < 0) goto LAB_00370cf8;
  local_bc = iVar14 * 2;
  iVar14 = sat_solver_addclause(psVar5,&local_bc,(lit *)&local_b8);
  if (iVar14 == 0) {
    return (Vec_Int_t *)0x0;
  }
  pVVar3 = local_a0;
  local_b8 = psVar5;
  if ((int)local_88 < 1) goto LAB_00370cb4;
  iVar14 = clock_gettime(3,&local_b0);
  psVar5 = local_b8;
  if (iVar14 < 0) {
    local_60 = 1;
  }
  else {
    lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                   SEXT816(CONCAT44(local_b0.tv_nsec._4_4_,(int)local_b0.tv_nsec)),8);
    local_60 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) +
               CONCAT44(local_b0.tv_sec._4_4_,(int)local_b0.tv_sec) * -1000000;
  }
  local_78 = (ulong)(uint)pCnf->nVars;
  local_a0->nSize = 0;
  lVar9 = 0;
  if ((vSuppOld != (Vec_Int_t *)0x0) && (0 < vSuppOld->nSize)) {
    lVar9 = 0;
    do {
      if (vSuppOld->pArray[lVar9] < -2) goto LAB_00370cf8;
      iVar14 = vSuppOld->pArray[lVar9] + 2;
      iVar2 = pCnf->nVars + iVar14;
      uVar11 = iVar14 * 2;
      local_98 = lVar9;
      local_90 = uVar11;
      if (iVar2 < 0) goto LAB_00370cf8;
      local_8c = iVar2 * 2 + 1;
      iVar14 = sat_solver_addclause(psVar5,(lit *)&local_90,(lit *)&local_88);
      if (iVar14 == 0) {
LAB_003708a4:
        puts("Unsat is detected earlier.");
        lVar9 = local_98;
        break;
      }
      local_8c = iVar2 * 2;
      local_90 = uVar11 | 1;
      iVar14 = sat_solver_addclause(psVar5,(lit *)&local_90,(lit *)&local_88);
      if (iVar14 == 0) goto LAB_003708a4;
      lVar9 = local_98 + 1;
    } while (lVar9 < vSuppOld->nSize);
  }
  psVar5 = local_b8;
  if ((vSuppOld == (Vec_Int_t *)0x0) ||
     (bVar1 = true, pVVar3 = local_a0, (int)lVar9 == vSuppOld->nSize)) {
    iVar14 = (int)local_78;
    uVar12 = (ulong)(uint)(iVar14 * 2);
    local_6c = 1;
    if (1 < (int)(uint)local_88) {
      local_6c = (uint)local_88;
    }
    local_78 = (ulong)(uint)(iVar14 << 2);
    local_58 = (ulong)(iVar14 * 4 + 1);
    uVar10 = 0;
    uVar13 = 0;
    local_80 = uVar12;
    do {
      iVar14 = (int)uVar13 + pCnf->nVars;
      uVar11 = iVar14 + 2;
      local_38 = uVar13;
      if ((int)((int)uVar13 + (int)uVar12 | uVar11) < 0) {
        __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1a8,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      iVar2 = (int)uVar10;
      iVar15 = (int)local_58 + iVar2;
      local_b0.tv_sec._4_4_ = iVar2 + 5;
      local_88 = CONCAT44(local_88._4_4_,local_b0.tv_sec._4_4_);
      local_b0.tv_nsec._0_4_ = iVar14 + 3 + uVar11;
      local_98 = CONCAT44(local_98._4_4_,(int)local_b0.tv_nsec);
      local_b0.tv_sec._0_4_ = iVar15;
      iVar14 = sat_solver_addclause(psVar5,(lit *)&local_b0,(lit *)((long)&local_b0.tv_nsec + 4));
      end = (lit *)((long)&local_b0.tv_nsec + 4);
      if (iVar14 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1ae,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_b0.tv_sec._4_4_ = iVar2 + 4;
      local_b0.tv_sec._0_4_ = iVar15;
      local_b0.tv_nsec._0_4_ = uVar11 * 2;
      local_68 = iVar15;
      local_64 = local_b0.tv_sec._4_4_;
      iVar14 = sat_solver_addclause(psVar5,(lit *)&local_b0,end);
      if (iVar14 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1b4,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      iVar2 = iVar2 + (int)local_78;
      local_b0.tv_sec._4_4_ = (int)local_88;
      local_b0.tv_sec._0_4_ = iVar2;
      local_b0.tv_nsec._0_4_ = uVar11 * 2;
      local_40 = uVar10;
      iVar14 = sat_solver_addclause(psVar5,(lit *)&local_b0,end);
      if (iVar14 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1ba,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      local_b0.tv_sec._4_4_ = local_64;
      local_b0.tv_nsec._0_4_ = (undefined4)local_98;
      local_b0.tv_sec._0_4_ = iVar2;
      iVar14 = sat_solver_addclause(psVar5,(lit *)&local_b0,end);
      uVar12 = local_80;
      pVVar3 = local_a0;
      if (iVar14 == 0) {
        __assert_fail("Cid",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                      ,0x1c0,"int sat_solver_add_xor(sat_solver *, int, int, int, int)");
      }
      iVar14 = (int)local_80;
      if (iVar14 < 0) goto LAB_00370cf8;
      Vec_IntPush(local_a0,local_68);
      s = local_b8;
      uVar11 = (int)local_38 + 1;
      uVar13 = (ulong)uVar11;
      uVar10 = (ulong)((int)local_40 + 2);
    } while (local_6c != uVar11);
    if (TimeOut != 0) {
      aVar6 = Abc_Clock();
      s->nRuntimeLimit = aVar6 + (long)TimeOut * 1000000;
    }
    iVar2 = sat_solver_solve(s,pVVar3->pArray,pVVar3->pArray + pVVar3->nSize,0,0,0,0);
    if (TimeOut != 0) {
      s->nRuntimeLimit = 0;
    }
    if (iVar2 == -1) {
      printf("Proved that the problem has a solution.  ");
      aVar6 = Abc_Clock();
      Abc_PrintTime(0x9b9e9a,(char *)(local_60 + aVar6),time);
      aVar6 = Abc_Clock();
      iVar2 = sat_solver_minimize_assumptions(local_b8,pVVar3->pArray,pVVar3->nSize,0);
      if (pVVar3->nSize < iVar2) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      pVVar3->nSize = iVar2;
      qsort(pVVar3->pArray,(long)iVar2,4,Vec_IntSortCompare1);
      printf("Found one feasible set of %d divisors.  ",(ulong)(uint)pVVar3->nSize);
      aVar7 = Abc_Clock();
      Abc_PrintTime(0x9b9e9a,(char *)(aVar7 - aVar6),time_00);
      if (pVVar3->nSize < 1) {
        bVar1 = true;
      }
      else {
        aVar6 = Abc_Clock();
        vWeights = Acb_DeriveWeights(local_50,local_48);
        psVar5 = local_b8;
        pVVar8 = Acb_FindSupport(local_b8,iVar14,vWeights,pVVar3,TimeOut);
        Vec_IntFree(vWeights);
        Vec_IntFree(pVVar3);
        bVar1 = pVVar8 != (Vec_Int_t *)0x0;
        if (pVVar8 == (Vec_Int_t *)0x0) {
          printf("Support minimization timed out after %d sec.\n",(ulong)(uint)TimeOut);
          sat_solver_delete(psVar5);
        }
        else {
          printf("Minimized support to %d supp vars.  ",(ulong)(uint)pVVar8->nSize);
          aVar7 = Abc_Clock();
          Abc_PrintTime(0x9b9e9a,(char *)(aVar7 - aVar6),time_01);
        }
        iVar14 = (int)local_80;
        pVVar3 = pVVar8;
      }
      if (!bVar1) goto LAB_00370cad;
      iVar2 = pVVar3->nSize;
      if (0 < iVar2) {
        piVar4 = pVVar3->pArray;
        lVar9 = 0;
        do {
          uVar11 = piVar4[lVar9];
          if ((int)uVar11 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          piVar4[lVar9] = (uVar11 >> 1) - iVar14;
          lVar9 = lVar9 + 1;
          iVar2 = pVVar3->nSize;
        } while (lVar9 < iVar2);
      }
      qsort(pVVar3->pArray,(long)iVar2,4,Vec_IntSortCompare1);
      bVar1 = true;
    }
    else if (iVar2 == 0) {
      bVar1 = false;
      printf("Support computation timed out after %d sec.\n",(ulong)(uint)TimeOut);
      sat_solver_delete(local_b8);
      Vec_IntFree(pVVar3);
    }
    else {
      if (iVar2 != 1) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbFunc.c"
                      ,0x4d6,
                      "Vec_Int_t *Acb_DerivePatchSupport(Cnf_Dat_t *, int, int, int, Vec_Int_t *, Acb_Ntk_t *, Vec_Int_t *, int)"
                     );
      }
      puts("ECO does not exist.");
      sat_solver_delete(local_b8);
      Vec_IntFree(pVVar3);
LAB_00370cad:
      bVar1 = false;
    }
  }
  if (!bVar1) {
    return (Vec_Int_t *)0x0;
  }
LAB_00370cb4:
  sat_solver_delete(local_b8);
  if (pVVar3 != (Vec_Int_t *)0x0) {
    qsort(pVVar3->pArray,(long)pVVar3->nSize,4,Vec_IntSortCompare1);
    return pVVar3;
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Acb_DerivePatchSupport( Cnf_Dat_t * pCnf, int iTar, int nTargets, int nCoDivs, Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF, Vec_Int_t * vSuppOld, int TimeOut )
{
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    int i, Lit;
    int iCoVarBeg = 1;
    int iCiVarBeg = pCnf->nVars - nTargets;
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 2 * pCnf->nVars + nCoDivs );
    // add clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add clauses
    pCnf->pMan = NULL;
    Cnf_DataLift( pCnf, pCnf->nVars );
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            return NULL;
    Cnf_DataLift( pCnf, -pCnf->nVars );
    // add output clause
    Lit = Abc_Var2Lit( iCoVarBeg+pCnf->nVars, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for targets
    // add negative literal
    Lit = Abc_Var2Lit( iCiVarBeg + iTar, 1 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // add positive literal
    Lit = Abc_Var2Lit( iCiVarBeg+pCnf->nVars + iTar, 0 );
    if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
        return NULL;
    // create XORs for divisors
    if ( nCoDivs > 0 )
    {
        abctime clk = Abc_Clock();
        int fUseMinAssump = 1;
        int iLit, nSuppNew, status;
        int iDivVar = 2 * pCnf->nVars;
        int pLits[2];
        int j = 0, iDivOld;
        Vec_IntClear( vSupp );
        if ( vSuppOld )
        {
            // start with predefined support
            Vec_IntForEachEntry( vSuppOld, iDivOld, j )
            {
                int iVar0 = iCoVarBeg+1+iDivOld;
                int iVar1 = iCoVarBeg+1+iDivOld+pCnf->nVars;
                //printf( "Selecting predefined divisor %d with weight %d\n", 
                //    iDivOld, Vec_IntEntry(&pNtkF->vObjWeight, Vec_IntEntry(vDivs, iDivOld)) );
                // add equality clauses
                pLits[0] = Abc_Var2Lit( iVar0, 0 );
                pLits[1] = Abc_Var2Lit( iVar1, 1 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
                pLits[0] = Abc_Var2Lit( iVar0, 1 );
                pLits[1] = Abc_Var2Lit( iVar1, 0 );
                if ( !sat_solver_addclause( pSat, pLits, pLits+2 ) )
                {
                    printf( "Unsat is detected earlier.\n" );
                    status = l_False;
                    break;
                }
            }
        }
        if ( vSuppOld == NULL || j == Vec_IntSize(vSuppOld) )
        {
            for ( i = 0; i < nCoDivs; i++ )
            {
                sat_solver_add_xor( pSat, iDivVar+i, iCoVarBeg+1+i, iCoVarBeg+1+i+pCnf->nVars, 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(iDivVar+i, 1) );
            }
            // try one run
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, TimeOut * CLOCKS_PER_SEC + Abc_Clock() );
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( TimeOut ) sat_solver_set_runtime_limit( pSat, 0 );
            if ( status == l_True )
            {
                printf( "ECO does not exist.\n" );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            if ( status == l_Undef )
            {
                printf( "Support computation timed out after %d sec.\n", TimeOut );
                sat_solver_delete( pSat );
                Vec_IntFree( vSupp );
                return NULL;
            }
            assert( status == l_False );
            printf( "Proved that the problem has a solution.  " );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            // find minimum subset
            if ( fUseMinAssump )
            {
                // solve in a standard way
                abctime clk = Abc_Clock();
                nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
                Vec_IntShrink( vSupp, nSuppNew );
                Vec_IntSort( vSupp, 0 );
                printf( "Found one feasible set of %d divisors.  ", Vec_IntSize(vSupp) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

                // perform minimization
                if ( Vec_IntSize(vSupp) > 0 )
                {
                    abctime clk = Abc_Clock();
                    Vec_Int_t * vTemp, * vWeights = Acb_DeriveWeights( vDivs, pNtkF );
                    vSupp = Acb_FindSupport( pSat, iDivVar, vWeights, vTemp = vSupp, TimeOut );
                    Vec_IntFree( vWeights );
                    Vec_IntFree( vTemp );
                    if ( vSupp == NULL )
                    {
                        printf( "Support minimization timed out after %d sec.\n", TimeOut );
                        sat_solver_delete( pSat );
                        return NULL;
                    }
                    printf( "Minimized support to %d supp vars.  ", Vec_IntSize(vSupp) );
                    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
                }
            }
            else
            {
                int * pFinal, nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
                Vec_IntClear( vSupp ); 
                for ( i = 0; i < nFinal; i++ )
                    Vec_IntPush( vSupp, Abc_LitNot(pFinal[i]) );
                // try one run
                status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
                assert( status == l_False );
                // try again
                nFinal = sat_solver_final( pSat, &pFinal );
                printf( "AnalyzeFinal returned %d (out of %d).\n", nFinal, Vec_IntSize(vSupp) );
            }
            // remap them into numbers
            Vec_IntForEachEntry( vSupp, iLit, i )
                Vec_IntWriteEntry( vSupp, i, Abc_Lit2Var(iLit)-iDivVar );
            Vec_IntSort( vSupp, 0 );
        }
    }
    sat_solver_delete( pSat );
    if ( vSupp ) Vec_IntSort( vSupp, 0 );
    return vSupp;
}